

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateDescriptorMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  ClassNameResolver *pCVar1;
  int iVar2;
  Printer *pPVar3;
  bool bVar4;
  int iVar5;
  JavaType JVar6;
  uint uVar7;
  MessageOptions *this_00;
  FileDescriptor *pFVar8;
  Descriptor *descriptor;
  ulong uVar9;
  size_type sVar10;
  reference ppFVar11;
  int i_00;
  Descriptor *descriptor_00;
  Descriptor *descriptor_01;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  FieldGeneratorInfo *local_a8;
  FieldGeneratorInfo *info;
  FieldDescriptor *field_1;
  FieldDescriptor *pFStack_90;
  int i_1;
  FieldDescriptor *field;
  undefined1 local_80 [4];
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar4 = MessageOptions::no_standard_descriptor_accessor(this_00);
  pPVar3 = local_18;
  if (!bVar4) {
    pCVar1 = this->name_resolver_;
    pFVar8 = Descriptor::file((this->super_MessageGenerator).descriptor_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&local_38,pCVar1,pFVar8);
    UniqueFileScopeIdentifier_abi_cxx11_
              (&local_58,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
    io::Printer::Print(pPVar3,
                       "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                       ,"fileclass",&local_38,"identifier",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_80);
  for (field._4_4_ = 0; iVar2 = field._4_4_,
      iVar5 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar2 < iVar5;
      field._4_4_ = field._4_4_ + 1) {
    pFStack_90 = Descriptor::field((this->super_MessageGenerator).descriptor_,field._4_4_);
    JVar6 = GetJavaType(pFStack_90);
    if (JVar6 == JAVATYPE_MESSAGE) {
      descriptor = FieldDescriptor::message_type(pFStack_90);
      bVar4 = IsMapEntry(descriptor);
      if (bVar4) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_80,&stack0xffffffffffffff70);
      }
    }
  }
  bVar4 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_80);
  if (!bVar4) {
    io::Printer::Print(local_18,
                       "@SuppressWarnings({\"rawtypes\"})\nprotected com.google.protobuf.MapField internalGetMapField(\n    int number) {\n  switch (number) {\n"
                      );
    io::Printer::Indent(local_18);
    io::Printer::Indent(local_18);
    for (field_1._4_4_ = 0; uVar9 = (ulong)field_1._4_4_,
        sVar10 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)local_80), uVar9 < sVar10; field_1._4_4_ = field_1._4_4_ + 1) {
      ppFVar11 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               *)local_80,(long)field_1._4_4_);
      info = (FieldGeneratorInfo *)*ppFVar11;
      local_a8 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info);
      pPVar3 = local_18;
      uVar7 = FieldDescriptor::number((FieldDescriptor *)info);
      SimpleItoa_abi_cxx11_(&local_c8,(protobuf *)(ulong)uVar7,i_00);
      io::Printer::Print(pPVar3,"case $number$:\n  return internalGet$capitalized_name$();\n",
                         "number",&local_c8,"capitalized_name",&local_a8->capitalized_name);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    io::Printer::Print(local_18,
                       "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
                      );
    io::Printer::Outdent(local_18);
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"  }\n}\n");
  }
  pPVar3 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_e8,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  pCVar1 = this->name_resolver_;
  pFVar8 = Descriptor::file((this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_108,pCVar1,pFVar8);
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_128,(java *)(this->super_MessageGenerator).descriptor_,descriptor_01);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print(pPVar3,
                     "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
                     ,"classname",&local_e8,"fileclass",&local_108,"identifier",&local_128,"ver",
                     &local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_80);
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateDescriptorMethods(io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
      "public static final com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptor() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
      "@SuppressWarnings({\"rawtypes\"})\n"
      "protected com.google.protobuf.MapField internalGetMapField(\n"
      "    int number) {\n"
      "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < map_fields.size(); ++i) {
      const FieldDescriptor* field = map_fields[i];
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
        "case $number$:\n"
        "  return internalGet$capitalized_name$();\n",
        "number", SimpleItoa(field->number()),
        "capitalized_name", info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
    "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n"
    "    internalGetFieldAccessorTable() {\n"
    "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
    "      .ensureFieldAccessorsInitialized(\n"
    "          $classname$.class, $classname$.Builder.class);\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_),
    "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "identifier", UniqueFileScopeIdentifier(descriptor_),
    "ver", GeneratedCodeVersionSuffix());
}